

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O1

void NodeDump(nodecontext *p,textwriter *Text)

{
  char *pcVar1;
  
  if (7 < (p->NodeSingleton)._Used) {
    pcVar1 = (p->NodeSingleton)._Begin;
    do {
      if (*(node **)pcVar1 != (node *)0x0) {
        NodeDumpObject(*(node **)pcVar1,Text);
      }
      pcVar1 = pcVar1 + 8;
    } while (pcVar1 != (p->NodeSingleton)._Begin + ((p->NodeSingleton)._Used & 0xfffffffffffffff8));
  }
  return;
}

Assistant:

void NodeDump(nodecontext* p,textwriter* Text)
{
    //no NodeLock, because may be stayed locked when dumping after crash
    node **i;
    for (i=ARRAYBEGIN(p->NodeSingleton,node*);i!=ARRAYEND(p->NodeSingleton,node*);++i)
        if (*i)
            NodeDumpObject(*i,Text);
}